

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O0

void __thiscall
GenericSection_RoundTripForPopulated_Test::~GenericSection_RoundTripForPopulated_Test
          (GenericSection_RoundTripForPopulated_Test *this)

{
  GenericSection_RoundTripForPopulated_Test *this_local;
  
  ~GenericSection_RoundTripForPopulated_Test(this);
  operator_delete(this,0x290);
  return;
}

Assistant:

TEST_F (GenericSection, RoundTripForPopulated) {
    using namespace pstore::exchange;

    constexpr auto kind = pstore::repo::section_kind::text;
    constexpr auto names_index = pstore::trailer::indices::name;
    constexpr auto comments = false;

    // The type used to store a text section's properties.
    using section_type = pstore::repo::enum_to_section_t<kind>;
    static_assert (std::is_same<section_type, pstore::repo::generic_section>::value,
                   "Expected text to map to generic_section");

    // Add names to the store so that external fixups can use then. add_export_strings()
    // yields a mapping from each name to its indirect-address.
    constexpr auto * name1 = "name1";
    constexpr auto * name2 = "name2";
    std::array<pstore::gsl::czstring, 2> names{{name1, name2}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<names_index> (export_db_, std::begin (names), std::end (names),
                                     std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<names_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                          export_db_.get_current_revision (), "", &exported_names,
                                          comments);


    pstore::repo::section_content exported_content;
    exported_content.align = 32U;
    {
        unsigned value = 0;
        std::generate_n (std::back_inserter (exported_content.data), 5U, [&value] () {
            return static_cast<decltype (exported_content.data)::value_type> (value++);
        });
    }
    exported_content.ifixups.emplace_back (pstore::repo::section_kind::data,
                                           pstore::repo::relocation_type{3},
                                           std::uint64_t{5} /*offset*/, std::int64_t{7} /*addend*/);
    exported_content.ifixups.emplace_back (
        pstore::repo::section_kind::read_only, pstore::repo::relocation_type{11},
        std::uint64_t{13} /*offset*/, std::int64_t{17} /*addend*/);
    exported_content.xfixups.emplace_back (
        indir_strings[name1], pstore::repo::relocation_type{19}, pstore::repo::binding::strong,
        std::uint64_t{23} /*offset*/, std::int64_t{29} /*addend*/);
    exported_content.xfixups.emplace_back (
        indir_strings[name2], pstore::repo::relocation_type{31}, pstore::repo::binding::weak,
        std::uint64_t{37} /*offset*/, std::int64_t{41} /*addend*/);


    std::string const exported_json =
        export_section<kind> (export_db_, exported_names, exported_content, comments);



    // Parse the exported names JSON. The resulting index-to-string mappings are then available via
    // imported_names.
    import_ns::string_mapping imported_names;
    {
        // Create matching names in the imported database.
        mock_mutex mutex;
        using transaction_lock = std::unique_lock<mock_mutex>;
        auto transaction = begin (import_db_, transaction_lock{mutex});

        auto parser = pstore::json::make_parser (
            import_ns::callbacks::make<
                import_ns::array_rule<import_ns::strings_array_members, decltype (&transaction),
                                      decltype (&imported_names)>> (&import_db_, &transaction,
                                                                    &imported_names));
        parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (parser.has_error ())
            << "Expected the JSON parse to succeed (" << parser.last_error ().message () << ')';

        transaction.commit ();
    }

    // Now set up the import. We'll build two objects: an instance of a section-creation-dispatcher
    // which knows how to build a text section and a section-content which will describe the
    // contents of that new section.
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);

    pstore::repo::section_content imported_content;

    // Find the rule that is used to import sections represented by an instance of section_type.
    using section_importer = import_ns::section_to_importer_t<section_type, decltype (inserter)>;
    auto parser = make_json_object_parser<section_importer> (&import_db_, kind, &imported_names,
                                                             &imported_content, &inserter);
    parser.input (exported_json).eof ();
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();

    ASSERT_EQ (dispatchers.size (), 1U)
        << "Expected a single creation dispatcher to be added to the dispatchers container";
    EXPECT_EQ (dispatchers.front ()->kind (), kind)
        << "The creation dispatcher should be able to create a text section";

    EXPECT_EQ (exported_content.kind, imported_content.kind);
    EXPECT_EQ (exported_content.align, imported_content.align);
    EXPECT_THAT (exported_content.data, testing::ContainerEq (imported_content.data));
    EXPECT_THAT (exported_content.ifixups, testing::ContainerEq (imported_content.ifixups));
    compare_external_fixups (export_db_, exported_content.xfixups, import_db_,
                             imported_content.xfixups);
}